

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall Wasm::WasmBytecodeGenerator::GenerateFunction(WasmBytecodeGenerator *this)

{
  IWasmByteCodeWriter *pIVar1;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  uint32 uVar5;
  uint uVar6;
  FunctionBody *pFVar7;
  WasmSignature *this_00;
  BlockInfo *pBVar8;
  WasmReaderBase *pWVar9;
  WasmCompilationException *pWVar10;
  ThreadContext *threadContext;
  WasmBinaryReader *this_01;
  AsmJsFunctionInfo *funcInfo;
  PolymorphicEmitInfo PVar11;
  AsmJsFunctionInfo *info;
  AutoDisableInterrupt autoDisableInterrupt;
  PolymorphicEmitInfo yieldInfo;
  WasmBlock local_48;
  WasmBlock funcBlockData;
  ByteCodeLabel blockLabel;
  ByteCodeLabel exitLabel;
  AutoCleanupGeneratorState autoCleanupGeneratorState;
  AutoProfilingPhase functionProfiler;
  WasmBytecodeGenerator *this_local;
  
  pFVar7 = GetFunctionBody(this);
  if (pFVar7 == (FunctionBody *)0x0) {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmBytecodePhase);
    if (bVar2) goto LAB_0161de68;
  }
  else {
    pFVar7 = GetFunctionBody(this);
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
    pFVar7 = GetFunctionBody(this);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmBytecodePhase,uVar3,LVar4);
    if (bVar2) {
LAB_0161de68:
      Output::Print(L"Generate WebAssembly Bytecode: ");
      pFVar7 = GetFunctionBody(this);
      Js::FunctionBody::DumpFullFunctionName(pFVar7);
      Output::Print(L"\n");
    }
  }
  pFVar7 = GetFunctionBody(this);
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
  pFVar7 = GetFunctionBody(this);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,WasmBytecodePhase,uVar3,LVar4);
  if (bVar2) {
    pWVar10 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(pWVar10,L"Compilation skipped");
    __cxa_throw(pWVar10,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  Js::AutoProfilingPhase::AutoProfilingPhase
            ((AutoProfilingPhase *)&autoCleanupGeneratorState,this->m_scriptContext,
             WasmBytecodePhase);
  this->m_maxArgOutDepth = 0;
  pIVar1 = this->m_writer;
  pFVar7 = GetFunctionBody(this);
  (*pIVar1->_vptr_IWasmByteCodeWriter[1])(pIVar1,pFVar7,&this->m_alloc);
  GenerateFunction()::AutoCleanupGeneratorState::AutoCleanupGeneratorState(Wasm::
  WasmBytecodeGenerator__(&blockLabel,this);
  funcBlockData.field_1.singleResult = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  WasmFunctionInfo::SetExitLabel(this->m_funcInfo,funcBlockData.field_1.singleResult);
  EnregisterLocals(this);
  funcBlockData._0_4_ = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  this_00 = WasmFunctionInfo::GetSignature(this->m_funcInfo);
  uVar5 = WasmSignature::GetSignatureId(this_00);
  WasmBlock::SetSignatureId(&local_48,uVar5);
  pBVar8 = PushLabel(this,local_48,funcBlockData._0_4_,true,false);
  this->m_funcBlock = pBVar8;
  EnterEvalStackScope(this,this->m_funcBlock);
  EmitBlockCommon(this,this->m_funcBlock,(bool *)0x0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)(uint)funcBlockData._0_4_);
  PVar11 = PopLabel(this,funcBlockData._0_4_);
  autoDisableInterrupt._8_4_ = PVar11.count;
  uVar5 = PolymorphicEmitInfo::Count
                    ((PolymorphicEmitInfo *)&autoDisableInterrupt.m_operationCompleted);
  if ((uVar5 != 0) || (uVar5 = WasmFunctionInfo::GetResultCount(this->m_funcInfo), uVar5 == 0)) {
    EmitReturnExpr(this,(PolymorphicEmitInfo *)&autoDisableInterrupt.m_operationCompleted);
  }
  pFVar7 = GetFunctionBody(this);
  if (pFVar7 == (FunctionBody *)0x0) {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmBytecodePhase);
    if (bVar2) goto LAB_0161e242;
  }
  else {
    pFVar7 = GetFunctionBody(this);
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
    pFVar7 = GetFunctionBody(this);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmBytecodePhase,uVar3,LVar4);
    if (bVar2) {
LAB_0161e242:
      PrintOpEnd(this);
    }
  }
  ExitEvalStackScope(this,this->m_funcBlock);
  SetUnreachableState(this,false);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])
            (this->m_writer,(ulong)funcBlockData.field_1.singleResult);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[7])(this->m_writer,8);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x21])(this->m_writer,(ulong)this->currentProfileId);
  pWVar9 = GetReader(this);
  uVar6 = (*pWVar9->_vptr_WasmReaderBase[1])();
  if ((uVar6 & 1) == 0) {
    pWVar10 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(pWVar10,L"Invalid function format");
    __cxa_throw(pWVar10,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  GenerateFunction::AutoCleanupGeneratorState::Complete((AutoCleanupGeneratorState *)&blockLabel);
  threadContext = Js::ScriptContext::GetThreadContext(this->m_scriptContext);
  AutoDisableInterrupt::AutoDisableInterrupt((AutoDisableInterrupt *)&info,threadContext,true);
  pFVar7 = GetFunctionBody(this);
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
  pFVar7 = GetFunctionBody(this);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,WasmBytecodePhase,uVar3,LVar4);
  if (!bVar2) {
    pFVar7 = GetFunctionBody(this);
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
    pFVar7 = GetFunctionBody(this);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,ByteCodePhase,uVar3,LVar4);
    if (!bVar2) goto LAB_0161e50a;
  }
  bVar2 = IsValidating(this);
  if (!bVar2) {
    pFVar7 = GetFunctionBody(this);
    Js::AsmJsByteCodeDumper::Dump(pFVar7,&this->mTypedRegisterAllocator,(AsmJsFunc *)0x0);
  }
LAB_0161e50a:
  pFVar7 = GetFunctionBody(this);
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
  pFVar7 = GetFunctionBody(this);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,WasmOpCodeDistributionPhase,uVar3,LVar4);
  if (bVar2) {
    this_01 = Js::WebAssemblyModule::GetReader(this->m_module);
    WasmBinaryReader::PrintOps(this_01);
  }
  pFVar7 = GetFunctionBody(this);
  funcInfo = Js::FunctionBody::GetAsmJsFunctionInfo(pFVar7);
  pFVar7 = GetFunctionBody(this);
  WAsmJs::TypedRegisterAllocator::CommitToFunctionBody(&this->mTypedRegisterAllocator,pFVar7);
  pFVar7 = GetFunctionBody(this);
  WAsmJs::TypedRegisterAllocator::CommitToFunctionInfo
            (&this->mTypedRegisterAllocator,funcInfo,pFVar7);
  pFVar7 = GetFunctionBody(this);
  Js::FunctionBody::CheckAndSetOutParamMaxDepth(pFVar7,this->m_maxArgOutDepth);
  AutoDisableInterrupt::Completed((AutoDisableInterrupt *)&info);
  AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)&info);
  GenerateFunction::AutoCleanupGeneratorState::~AutoCleanupGeneratorState
            ((AutoCleanupGeneratorState *)&blockLabel);
  Js::AutoProfilingPhase::~AutoProfilingPhase((AutoProfilingPhase *)&autoCleanupGeneratorState);
  return;
}

Assistant:

void WasmBytecodeGenerator::GenerateFunction()
{
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (DO_WASM_TRACE_BYTECODE)
    {
        Output::Print(_u("Generate WebAssembly Bytecode: "));
        GetFunctionBody()->DumpFullFunctionName();
        Output::Print(_u("\n"));
    }
#endif
    if (PHASE_OFF(Js::WasmBytecodePhase, GetFunctionBody()))
    {
        throw WasmCompilationException(_u("Compilation skipped"));
    }
    Js::AutoProfilingPhase functionProfiler(m_scriptContext, Js::WasmBytecodePhase);
    Unused(functionProfiler);

    m_maxArgOutDepth = 0;

    m_writer->Begin(GetFunctionBody(), &m_alloc);
    struct AutoCleanupGeneratorState
    {
        WasmBytecodeGenerator* gen;
        AutoCleanupGeneratorState(WasmBytecodeGenerator* gen) : gen(gen) {}
        ~AutoCleanupGeneratorState()
        {
            if (gen)
            {
                TRACE_WASM(PHASE_TRACE(Js::WasmBytecodePhase, gen->GetFunctionBody()), _u("\nHad Compilation error!"));
                gen->GetReader()->FunctionEnd();
                gen->m_originalWriter->Reset();
            }
        }
        void Complete()
        {
            gen->m_writer->End();
            gen->GetReader()->FunctionEnd();
            gen = nullptr;
        }
    };
    AutoCleanupGeneratorState autoCleanupGeneratorState(this);
    Js::ByteCodeLabel exitLabel = m_writer->DefineLabel();
    m_funcInfo->SetExitLabel(exitLabel);
    EnregisterLocals();

    // The function's yield type is the return type
    Js::ByteCodeLabel blockLabel = m_writer->DefineLabel();
    WasmBlock funcBlockData;
    funcBlockData.SetSignatureId(m_funcInfo->GetSignature()->GetSignatureId());
    m_funcBlock = PushLabel(funcBlockData, blockLabel, true, false);
    EnterEvalStackScope(m_funcBlock);
    EmitBlockCommon(m_funcBlock);
    m_writer->MarkAsmJsLabel(blockLabel);
    PolymorphicEmitInfo yieldInfo = PopLabel(blockLabel);
    if (yieldInfo.Count() > 0 || m_funcInfo->GetResultCount() == 0)
    {
        EmitReturnExpr(&yieldInfo);
    }
    DebugPrintOpEnd();
    ExitEvalStackScope(m_funcBlock);
    SetUnreachableState(false);
    m_writer->MarkAsmJsLabel(exitLabel);
    m_writer->EmptyAsm(Js::OpCodeAsmJs::Ret);
    m_writer->SetCallSiteCount(this->currentProfileId);

    if (!GetReader()->IsCurrentFunctionCompleted())
    {
        throw WasmCompilationException(_u("Invalid function format"));
    }

    autoCleanupGeneratorState.Complete();
    // Make sure we don't have any unforeseen exceptions as we finalize the body
    AutoDisableInterrupt autoDisableInterrupt(m_scriptContext->GetThreadContext(), true);

#if DBG_DUMP
    if ((
        PHASE_DUMP(Js::WasmBytecodePhase, GetFunctionBody()) ||
        PHASE_DUMP(Js::ByteCodePhase, GetFunctionBody()) 
        ) && !IsValidating())
    {
        Js::AsmJsByteCodeDumper::Dump(GetFunctionBody(), &mTypedRegisterAllocator, nullptr);
    }
    if (PHASE_DUMP(Js::WasmOpCodeDistributionPhase, GetFunctionBody()))
    {
        m_module->GetReader()->PrintOps();
    }
#endif

    Js::AsmJsFunctionInfo* info = GetFunctionBody()->GetAsmJsFunctionInfo();
    mTypedRegisterAllocator.CommitToFunctionBody(GetFunctionBody());
    mTypedRegisterAllocator.CommitToFunctionInfo(info, GetFunctionBody());

    GetFunctionBody()->CheckAndSetOutParamMaxDepth(m_maxArgOutDepth);
    autoDisableInterrupt.Completed();
}